

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall Js::FunctionBody::RedeferFunctionObjectTypes(FunctionBody *this)

{
  RecyclerWeakReference<Js::ScriptFunctionType> *pRVar1;
  ScriptFunctionType *pSVar2;
  List<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>
  *pLVar3;
  int i;
  long lVar4;
  anon_class_8_1_8991fb9c local_30;
  
  local_30.this = this;
  pLVar3 = FunctionProxy::
           GetAuxPtr<(Js::FunctionProxy::AuxPointerType)7,JsUtil::List<Memory::RecyclerWeakReference<Js::ScriptFunctionType>*,Memory::Recycler,false,Js::WeakRefFreeListedRemovePolicy,DefaultComparer>*>
                     ((FunctionProxy *)this);
  if (pLVar3 != (List<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>
                 *)0x0) {
    for (lVar4 = 0;
        lVar4 < (pLVar3->
                super_ReadOnlyList<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_DefaultComparer>
                ).count; lVar4 = lVar4 + 1) {
      pRVar1 = (pLVar3->
               super_ReadOnlyList<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_DefaultComparer>
               ).buffer.ptr[lVar4].ptr;
      if ((((ulong)pRVar1 & 1) == 0 &&
           pRVar1 != (RecyclerWeakReference<Js::ScriptFunctionType> *)0x0) &&
         (pSVar2 = (ScriptFunctionType *)(pRVar1->super_RecyclerWeakReferenceBase).strongRef,
         pSVar2 != (ScriptFunctionType *)0x0)) {
        RedeferFunctionObjectTypes::anon_class_8_1_8991fb9c::operator()(&local_30,pSVar2);
      }
    }
  }
  pSVar2 = (this->super_ParseableFunctionInfo).super_FunctionProxy.deferredPrototypeType.ptr;
  if (pSVar2 != (ScriptFunctionType *)0x0) {
    RedeferFunctionObjectTypes::anon_class_8_1_8991fb9c::operator()(&local_30,pSVar2);
  }
  pSVar2 = (this->super_ParseableFunctionInfo).super_FunctionProxy.undeferredFunctionType.ptr;
  if (pSVar2 != (ScriptFunctionType *)0x0) {
    RedeferFunctionObjectTypes::anon_class_8_1_8991fb9c::operator()(&local_30,pSVar2);
  }
  return;
}

Assistant:

void FunctionBody::RedeferFunctionObjectTypes()
    {
        this->MapFunctionObjectTypes([&](ScriptFunctionType* functionType)
        {
            Assert(functionType->GetTypeId() == TypeIds_Function);

            if (!CrossSite::IsThunk(functionType->GetEntryPoint()))
            {
                functionType->SetEntryPoint(GetScriptContext()->DeferredParsingThunk);
            }
            if (!CrossSite::IsThunk(functionType->GetEntryPointInfo()->jsMethod))
            {
                functionType->GetEntryPointInfo()->jsMethod = GetScriptContext()->DeferredParsingThunk;
            }
        });
    }